

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O3

void __thiscall dgrminer::PartialUnion::outputEncodingToFile(PartialUnion *this,string *filename)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  mapped_type *pmVar3;
  long *plVar4;
  _Base_ptr p_Var5;
  ofstream myfile;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)filename);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"label,label_int,is_change,label_int_prev",0x28);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  p_Var5 = (this->labelEncoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->labelEncoding)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\"",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\",",2);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,p_Var5[2]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
      std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::operator[]
                (&this->labelIsChange,(key_type *)(p_Var5 + 2));
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
      pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&this->antecedentLabelsOfLabels,(key_type *)(p_Var5 + 2));
      plVar4 = (long *)std::ostream::operator<<((ostream *)poVar2,*pmVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void PartialUnion::outputEncodingToFile(string filename)
	{
		ofstream myfile;

		myfile.open(filename);

		myfile << "label,label_int,is_change,label_int_prev" << endl;
		for (std::map<std::string, int>::iterator it = labelEncoding.begin(); it != labelEncoding.end(); ++it)
		{
			myfile << "\"" << it->first << "\"," << it->second << "," << labelIsChange[it->second] << "," << antecedentLabelsOfLabels[it->second] << endl;
		}

		myfile.close();
	}